

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O1

void __thiscall
cmListFileBacktrace::cmListFileBacktrace(cmListFileBacktrace *this,cmStateSnapshot *snapshot)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  cmStateSnapshot local_28;
  
  cmStateSnapshot::GetCallStackBottom(&local_28,snapshot);
  (this->TopEntry).super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x68);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00624790;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)local_28.State;
  *(cmLinkedTree<cmStateDetail::SnapshotDataType> **)&p_Var1[1]._M_use_count =
       local_28.Position.Tree;
  p_Var1[2]._vptr__Sp_counted_base = (_func_int **)local_28.Position.Position;
  p_Var1[5]._M_use_count = 0;
  p_Var1[5]._M_weak_count = 0;
  p_Var1[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  (this->TopEntry).super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  (this->TopEntry).super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)(p_Var1 + 1);
  return;
}

Assistant:

cmListFileBacktrace::cmListFileBacktrace(cmStateSnapshot const& snapshot)
  : TopEntry(std::make_shared<Entry const>(snapshot.GetCallStackBottom()))
{
}